

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O1

void test_bson_json_read_invalid(void)

{
  char cVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  undefined8 uVar6;
  int *__haystack;
  bson_t bson;
  bson_error_t error;
  undefined1 auStack_6a0 [16];
  code *pcStack_690;
  int iStack_688;
  int iStack_684;
  char acStack_680 [504];
  code *pcStack_488;
  undefined1 auStack_480 [232];
  long lStack_398;
  undefined1 *puStack_390;
  code *pcStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  int local_2a0;
  int local_29c;
  
  local_310 = 0;
  uStack_308 = 0;
  local_320 = 0;
  uStack_318 = 0;
  local_330 = 0;
  uStack_328 = 0;
  local_340 = 0;
  uStack_338 = 0;
  local_350 = 0;
  uStack_348 = 0;
  local_360 = 0;
  uStack_358 = 0;
  local_370 = 0;
  uStack_368 = 0;
  local_380 = 0x500000003;
  uStack_378 = 5;
  pcStack_388 = (code *)0x12fc49;
  lVar3 = bson_json_reader_new(0,test_bson_json_read_invalid_helper,0,0,0);
  pcStack_388 = (code *)0x12fc5f;
  iVar2 = bson_json_reader_read(lVar3,&local_380,&local_2a0);
  if (iVar2 == -1) {
    if (local_2a0 != 1) goto LAB_0012fc96;
    if (local_29c == 1) {
      pcStack_388 = (code *)0x12fc80;
      bson_json_reader_destroy(lVar3);
      pcStack_388 = (code *)0x12fc88;
      bson_destroy(&local_380);
      return;
    }
  }
  else {
    pcStack_388 = (code *)0x12fc96;
    test_bson_json_read_invalid_cold_1();
LAB_0012fc96:
    pcStack_388 = (code *)0x12fc9b;
    test_bson_json_read_invalid_cold_2();
  }
  pcStack_388 = test_bson_json_read_raw_utf8;
  test_bson_json_read_invalid_cold_3();
  pcStack_488 = (code *)0x12fcc7;
  lStack_398 = lVar3;
  puStack_390 = (undefined1 *)&local_380;
  pcStack_388 = (code *)&stack0xfffffffffffffff8;
  lVar4 = bson_new_from_json(anon_var_dwarf_1a5dd,0xffffffffffffffff,0);
  if (lVar4 == 0) {
    pcStack_488 = (code *)0x12fd62;
    test_bson_json_read_raw_utf8_cold_5();
LAB_0012fd62:
    pcStack_488 = (code *)0x12fd67;
    test_bson_json_read_raw_utf8_cold_1();
    lVar4 = lVar3;
LAB_0012fd67:
    pcStack_488 = (code *)0x12fd6c;
    test_bson_json_read_raw_utf8_cold_4();
LAB_0012fd6c:
    pcStack_488 = (code *)0x12fd74;
    test_bson_json_read_raw_utf8_cold_2();
  }
  else {
    pcStack_488 = (code *)0x12fce8;
    cVar1 = bson_iter_init_find(auStack_480,lVar4,anon_var_dwarf_49b7 + 0xc);
    lVar3 = lVar4;
    if (cVar1 == '\0') goto LAB_0012fd62;
    pcStack_488 = (code *)0x12fcf4;
    pcVar5 = (char *)bson_iter_key(auStack_480);
    if (pcVar5 != anon_var_dwarf_49b7 + 0xc) {
      pcStack_488 = (code *)0x12fd01;
      pcVar5 = (char *)bson_iter_key(auStack_480);
      pcStack_488 = (code *)0x12fd10;
      iVar2 = strcmp(pcVar5,anon_var_dwarf_49b7 + 0xc);
      if (iVar2 == 0) goto LAB_0012fd14;
      goto LAB_0012fd6c;
    }
LAB_0012fd14:
    pcStack_488 = (code *)0x12fd1e;
    pcVar5 = (char *)bson_iter_utf8(auStack_480);
    if (pcVar5 == anon_var_dwarf_49b7 + 0xc) {
LAB_0012fd40:
      pcStack_488 = (code *)0x12fd48;
      cVar1 = bson_iter_next(auStack_480);
      if (cVar1 == '\0') {
        pcStack_488 = (code *)0x12fd54;
        bson_destroy(lVar4);
        return;
      }
      goto LAB_0012fd67;
    }
    pcStack_488 = (code *)0x12fd2d;
    pcVar5 = (char *)bson_iter_utf8(auStack_480,0);
    pcStack_488 = (code *)0x12fd3c;
    iVar2 = strcmp(pcVar5,anon_var_dwarf_49b7 + 0xc);
    if (iVar2 == 0) goto LAB_0012fd40;
  }
  pcStack_488 = test_bson_json_read_corrupt_utf8;
  test_bson_json_read_raw_utf8_cold_3();
  __haystack = &iStack_688;
  pcStack_690 = (code *)0x12fd96;
  pcStack_488 = (code *)lVar4;
  memset(&iStack_688,0,0x200);
  pcStack_690 = (code *)0x12fdac;
  lVar3 = bson_new_from_json(anon_var_dwarf_1a625,0xffffffffffffffff,&iStack_688);
  if (lVar3 == 0) {
    __haystack = &iStack_688;
    if (iStack_688 != 1) goto LAB_0012fe2e;
    __haystack = &iStack_688;
    if (iStack_684 != 1) goto LAB_0012fe33;
    __haystack = (int *)acStack_680;
    pcStack_690 = (code *)0x12fdd6;
    pcVar5 = strstr((char *)__haystack,"invalid bytes in UTF8 string");
    if (pcVar5 == (char *)0x0) goto LAB_0012fe38;
    pcStack_690 = (code *)0x12fdf1;
    lVar3 = bson_new_from_json(anon_var_dwarf_1a631,0xffffffffffffffff,&iStack_688);
    if (lVar3 != 0) goto LAB_0012fe29;
    if (iStack_688 != 1) goto LAB_0012fe40;
    if (iStack_684 == 1) {
      pcStack_690 = (code *)0x12fe16;
      pcVar5 = strstr((char *)__haystack,"invalid bytes in UTF8 string");
      if (pcVar5 != (char *)0x0) {
        return;
      }
      goto LAB_0012fe4a;
    }
  }
  else {
    pcStack_690 = (code *)0x12fe29;
    test_bson_json_read_corrupt_utf8_cold_1();
LAB_0012fe29:
    pcStack_690 = (code *)0x12fe2e;
    test_bson_json_read_corrupt_utf8_cold_4();
LAB_0012fe2e:
    pcStack_690 = (code *)0x12fe33;
    test_bson_json_read_corrupt_utf8_cold_2();
LAB_0012fe33:
    pcStack_690 = (code *)0x12fe38;
    test_bson_json_read_corrupt_utf8_cold_3();
LAB_0012fe38:
    pcStack_690 = (code *)0x12fe40;
    test_bson_json_read_corrupt_utf8_cold_8();
LAB_0012fe40:
    pcStack_690 = (code *)0x12fe45;
    test_bson_json_read_corrupt_utf8_cold_5();
  }
  pcStack_690 = (code *)0x12fe4a;
  test_bson_json_read_corrupt_utf8_cold_6();
LAB_0012fe4a:
  pcStack_690 = test_bson_json_read_decimal128;
  test_bson_json_read_corrupt_utf8_cold_7();
  pcStack_690 = (code *)__haystack;
  bson_decimal128_from_string("123.5",auStack_6a0);
  uVar6 = bson_bcon_magic();
  iVar2 = 0x14aa08;
  uVar6 = bcon_new(0,"decimal",uVar6,0x12,auStack_6a0,0);
  _test_bson_json_read_compare("{ \"decimal\" : { \"$numberDecimal\" : \"123.5\" }}",iVar2,uVar6,0);
  return;
}

Assistant:

static void
test_bson_json_read_invalid (void)
{
   bson_error_t error;
   bson_json_reader_t *reader;
   int r;
   bson_t bson = BSON_INITIALIZER;

   reader = bson_json_reader_new (
      NULL, test_bson_json_read_invalid_helper, NULL, false, 0);

   r = bson_json_reader_read (reader, &bson, &error);

   BSON_ASSERT (r == -1);
   BSON_ASSERT (error.domain == BSON_ERROR_JSON);
   BSON_ASSERT (error.code == BSON_JSON_ERROR_READ_CORRUPT_JS);

   bson_json_reader_destroy (reader);
   bson_destroy (&bson);
}